

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdMtlx.cc
# Opt level: O0

bool tinyusdz::ToPrimSpec(MtlxModel *model,PrimSpec *ps,string *err)

{
  bool bVar1;
  PropertyMap *pPVar2;
  mapped_type *pmVar3;
  ostream *poVar4;
  string *psVar5;
  Specifier *pSVar6;
  pointer *this;
  reference ppVar7;
  vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_> *pvVar8;
  undefined1 local_23d8 [8];
  PrimSpec root;
  PrimSpec shaders;
  PrimSpec material;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MtlxMaterial>
  *item;
  const_iterator __end1;
  const_iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MtlxMaterial,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MtlxMaterial>_>_>
  *__range1;
  PrimSpec materials;
  ostringstream local_df8 [8];
  ostringstream ss_e;
  allocator local_c79;
  key_type local_c78 [4];
  Token local_c58;
  Property local_c38;
  allocator local_651;
  key_type local_650 [4];
  Token local_630;
  Property local_610;
  char *local_30;
  char *kAutodeskStandardSurface;
  string *err_local;
  PrimSpec *ps_local;
  MtlxModel *model_local;
  
  local_30 = "AutodeskStandardSurface";
  kAutodeskStandardSurface = (char *)err;
  err_local = (string *)ps;
  ps_local = (PrimSpec *)model;
  bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &model->shader_name,"UsdPreviewSurface");
  if (bVar1) {
    Token::Token(&local_630,"UsdPreviewSurface");
    detail::MakeProperty<tinyusdz::Token>(&local_610,&local_630);
    pPVar2 = PrimSpec::props_abi_cxx11_((PrimSpec *)err_local);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)local_650,"info:id",&local_651);
    pmVar3 = ::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
             ::operator[](pPVar2,local_650);
    Property::operator=(pmVar3,&local_610);
    ::std::__cxx11::string::~string((string *)local_650);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_651);
    Property::~Property(&local_610);
    Token::~Token(&local_630);
  }
  else {
    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &ps_local->_variantSets,"AutodeskStandardSurface");
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream(local_df8);
      poVar4 = ::std::operator<<((ostream *)local_df8,"[error]");
      poVar4 = ::std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdMtlx.cc"
                                );
      poVar4 = ::std::operator<<(poVar4,":");
      poVar4 = ::std::operator<<(poVar4,"ToPrimSpec");
      poVar4 = ::std::operator<<(poVar4,"():");
      poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x3bc);
      ::std::operator<<(poVar4," ");
      poVar4 = ::std::operator<<((ostream *)local_df8,"Unsupported shader_name: ");
      poVar4 = ::std::operator<<(poVar4,(string *)&ps_local->_variantSets);
      ::std::operator<<(poVar4,"\n");
      if (kAutodeskStandardSurface != (char *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::__cxx11::string::operator+=
                  ((string *)kAutodeskStandardSurface,
                   (string *)
                   &materials._asset_search_paths.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        ::std::__cxx11::string::~string
                  ((string *)
                   &materials._asset_search_paths.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      model_local._7_1_ = 0;
      ::std::__cxx11::ostringstream::~ostringstream(local_df8);
      goto LAB_0040a4b9;
    }
    Token::Token(&local_c58,"AutodeskStandardSurface");
    detail::MakeProperty<tinyusdz::Token>(&local_c38,&local_c58);
    pPVar2 = PrimSpec::props_abi_cxx11_((PrimSpec *)err_local);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)local_c78,"info:id",&local_c79);
    pmVar3 = ::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
             ::operator[](pPVar2,local_c78);
    Property::operator=(pmVar3,&local_c38);
    ::std::__cxx11::string::~string((string *)local_c78);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_c79);
    Property::~Property(&local_c38);
    Token::~Token(&local_c58);
  }
  PrimSpec::PrimSpec((PrimSpec *)&__range1);
  psVar5 = PrimSpec::name_abi_cxx11_((PrimSpec *)&__range1);
  ::std::__cxx11::string::operator=((string *)psVar5,"Materials");
  pSVar6 = PrimSpec::specifier((PrimSpec *)&__range1);
  *pSVar6 = Def;
  this = &(ps_local->_primChildren).
          super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
          super__Vector_impl_data._M_finish;
  __end1 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MtlxMaterial,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MtlxMaterial>_>_>
           ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MtlxMaterial,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MtlxMaterial>_>_>
                    *)this);
  item = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MtlxMaterial>
          *)::std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MtlxMaterial,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MtlxMaterial>_>_>
            ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MtlxMaterial,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MtlxMaterial>_>_>
                   *)this);
  while( true ) {
    bVar1 = ::std::operator!=(&__end1,(_Self *)&item);
    if (!bVar1) break;
    ppVar7 = ::std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MtlxMaterial>_>
             ::operator*(&__end1);
    PrimSpec::PrimSpec((PrimSpec *)
                       &shaders._asset_search_paths.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pSVar6 = PrimSpec::specifier((PrimSpec *)
                                 &shaders._asset_search_paths.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    *pSVar6 = Def;
    psVar5 = PrimSpec::typeName_abi_cxx11_
                       ((PrimSpec *)
                        &shaders._asset_search_paths.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    ::std::__cxx11::string::operator=((string *)psVar5,"Material");
    psVar5 = PrimSpec::name_abi_cxx11_
                       ((PrimSpec *)
                        &shaders._asset_search_paths.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    ::std::__cxx11::string::operator=((string *)psVar5,(string *)&ppVar7->second);
    PrimSpec::~PrimSpec((PrimSpec *)
                        &shaders._asset_search_paths.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    ::std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MtlxMaterial>_>
    ::operator++(&__end1);
  }
  PrimSpec::PrimSpec((PrimSpec *)
                     &root._asset_search_paths.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  psVar5 = PrimSpec::name_abi_cxx11_
                     ((PrimSpec *)
                      &root._asset_search_paths.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ::std::__cxx11::string::operator=((string *)psVar5,"Shaders");
  pSVar6 = PrimSpec::specifier((PrimSpec *)
                               &root._asset_search_paths.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  *pSVar6 = Def;
  PrimSpec::PrimSpec((PrimSpec *)local_23d8);
  psVar5 = PrimSpec::name_abi_cxx11_((PrimSpec *)local_23d8);
  ::std::__cxx11::string::operator=((string *)psVar5,"MaterialX");
  pSVar6 = PrimSpec::specifier((PrimSpec *)local_23d8);
  *pSVar6 = Def;
  pvVar8 = PrimSpec::children((PrimSpec *)local_23d8);
  ::std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>::push_back
            ((vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_> *)pvVar8,
             (value_type *)&__range1);
  pvVar8 = PrimSpec::children((PrimSpec *)local_23d8);
  ::std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>::push_back
            ((vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_> *)pvVar8,
             (value_type *)
             &root._asset_search_paths.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  PrimSpec::operator=((PrimSpec *)err_local,(PrimSpec *)local_23d8);
  model_local._7_1_ = 1;
  PrimSpec::~PrimSpec((PrimSpec *)local_23d8);
  PrimSpec::~PrimSpec((PrimSpec *)
                      &root._asset_search_paths.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  PrimSpec::~PrimSpec((PrimSpec *)&__range1);
LAB_0040a4b9:
  return (bool)(model_local._7_1_ & 1);
}

Assistant:

bool ToPrimSpec(const MtlxModel &model, PrimSpec &ps, std::string *err) {
  //
  // def "MaterialX" {
  //
  //   def "Materials" {
  //     def Material ... {
  //     }
  //   }
  //   def "Shaders" {
  //   }
  constexpr auto kAutodeskStandardSurface = "AutodeskStandardSurface";

  if (model.shader_name == kUsdPreviewSurface) {
    ps.props()["info:id"] =
        detail::MakeProperty(value::token(kUsdPreviewSurface));
  } else if (model.shader_name == kAutodeskStandardSurface) {
    ps.props()["info:id"] =
        detail::MakeProperty(value::token(kAutodeskStandardSurface));
  } else {
    PUSH_ERROR_AND_RETURN("Unsupported shader_name: " << model.shader_name);
  }

  PrimSpec materials;
  materials.name() = "Materials";
  materials.specifier() = Specifier::Def;

  for (const auto &item : model.surface_materials) {
    PrimSpec material;
    material.specifier() = Specifier::Def;
    material.typeName() = "Material";

    material.name() = item.second.name;
  }

  PrimSpec shaders;
  shaders.name() = "Shaders";
  shaders.specifier() = Specifier::Def;

  PrimSpec root;
  root.name() = "MaterialX";
  root.specifier() = Specifier::Def;

  root.children().push_back(materials);
  root.children().push_back(shaders);

  ps = std::move(root);

  return true;
}